

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O2

int log_aspect_detach(log_aspect aspect,log_policy policy)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 1;
  while( true ) {
    if (lVar2 - aspect->count == 1) {
      return 1;
    }
    if (aspect->policies[lVar2 + -1] == policy) break;
    lVar2 = lVar2 + 1;
  }
  iVar1 = log_policy_destroy(aspect->policies[lVar2 + -1]);
  memmove(aspect->policies + lVar2 + -1,aspect->policies + lVar2,aspect->count - lVar2);
  aspect->count = aspect->count - 1;
  return iVar1;
}

Assistant:

int log_aspect_detach(log_aspect aspect, log_policy policy)
{
	size_t iterator;

	for (iterator = 0; iterator < aspect->count; ++iterator)
	{
		if (policy == aspect->policies[iterator])
		{
			int result = log_policy_destroy(aspect->policies[iterator]);

			memmove(&aspect->policies[iterator], &aspect->policies[iterator + 1], aspect->count - iterator - 1);

			--aspect->count;

			return result;
		}
	}

	return 1;
}